

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Min_f32(w3Interp *this)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = w3Stack::pop_f32(&this->super_w3Stack);
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  if (*pfVar1 <= fVar2) {
    fVar2 = *pfVar1;
  }
  *pfVar1 = fVar2;
  return;
}

Assistant:

INTERP (Min_f32)
{
    const float z2 = pop_f32 ();
    float& z1 = f32 ();
    z1 = std::min (z1, z2);
}